

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsComponentGetPartSubEntities
              (FmsComponent comp,FmsInt part_id,FmsEntityType type,FmsIntType *ent_id_type,
              void **ents,FmsInt *num_ents)

{
  _FmsPart_private *p_Var1;
  int iVar2;
  
  if (comp == (FmsComponent)0x0) {
    iVar2 = 1;
  }
  else {
    iVar2 = 2;
    if ((part_id < comp->num_parts) && (iVar2 = 3, type < FMS_NUM_ENTITY_TYPES)) {
      p_Var1 = comp->parts;
      if (ent_id_type != (FmsIntType *)0x0) {
        *ent_id_type = p_Var1[part_id].entities_ids_type[type];
      }
      if (ents != (void **)0x0) {
        *ents = p_Var1[part_id].entities_ids[type];
      }
      iVar2 = 0;
      if (num_ents != (FmsInt *)0x0) {
        *num_ents = p_Var1[part_id].num_entities[type];
        return 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int FmsComponentGetPartSubEntities(FmsComponent comp, FmsInt part_id,
                                   FmsEntityType type, FmsIntType *ent_id_type,
                                   const void **ents, FmsInt *num_ents) {
  if (!comp) { E_RETURN(1); }
  if (part_id >= comp->num_parts) { E_RETURN(2); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(3); }
  // if (FmsEntityDim[type] >= comp->dim) { E_RETURN(4); }
  struct _FmsPart_private *part = &comp->parts[part_id];
  if (ent_id_type) { *ent_id_type = part->entities_ids_type[type]; }
  if (ents) { *ents = part->entities_ids[type]; }
  if (num_ents) { *num_ents = part->num_entities[type]; }
  return 0;
}